

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O3

void vkt::SpirVAssembly::createPipelineShaderStages
               (DeviceInterface *vk,VkDevice vkDevice,InstanceContext *instance,Context *context,
               vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
               *modules,vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                        *createInfos)

{
  long *plVar1;
  int *piVar2;
  pointer *ppVVar3;
  iterator __position;
  undefined8 *puVar4;
  const_iterator cVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  EntryToStage *stage;
  _Base_ptr p_Var8;
  ModuleHandleSp mod;
  VkPipelineShaderStageCreateInfo shaderParam;
  void *local_88;
  long *plStack_80;
  long local_78;
  VkShaderModule VStack_70;
  char *local_68;
  VkSpecializationInfo *pVStack_60;
  _Rb_tree_node_base *local_50;
  DeviceInterface *local_48;
  VkDevice local_40;
  Context *local_38;
  
  p_Var7 = (instance->moduleMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50 = &(instance->moduleMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != local_50) {
    local_48 = vk;
    local_40 = vkDevice;
    local_38 = context;
    do {
      puVar4 = (undefined8 *)operator_new(0x20);
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                      *)local_38->m_progCollection,(key_type *)(p_Var7 + 1));
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_88,local_48,local_40,
                 *(ProgramBinary **)(cVar5._M_node + 2),0);
      puVar4[2] = local_78;
      puVar4[3] = VStack_70.m_internal;
      *puVar4 = local_88;
      puVar4[1] = plStack_80;
      local_88 = (void *)0x0;
      plStack_80 = (long *)0x0;
      local_78 = 0;
      VStack_70.m_internal = 0;
      plVar6 = (long *)operator_new(0x20);
      *(undefined4 *)(plVar6 + 1) = 0;
      *(undefined4 *)((long)plVar6 + 0xc) = 0;
      *plVar6 = (long)&PTR__SharedPtrState_00cef2f0;
      plVar6[2] = (long)puVar4;
      *(undefined4 *)(plVar6 + 1) = 1;
      *(undefined4 *)((long)plVar6 + 0xc) = 1;
      LOCK();
      *(int *)(plVar6 + 1) = (int)plVar6[1] + 1;
      UNLOCK();
      LOCK();
      *(int *)((long)plVar6 + 0xc) = *(int *)((long)plVar6 + 0xc) + 1;
      UNLOCK();
      local_88 = puVar4;
      plStack_80 = plVar6;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>>
                  *)modules,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> *)&local_88);
      if (plStack_80 != (long *)0x0) {
        LOCK();
        plVar1 = plStack_80 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        UNLOCK();
        if ((int)*plVar1 == 0) {
          local_88 = (void *)0x0;
          (**(code **)(*plStack_80 + 0x10))();
        }
        LOCK();
        piVar2 = (int *)((long)plStack_80 + 0xc);
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (plStack_80 != (long *)0x0)) {
          (**(code **)(*plStack_80 + 8))();
        }
      }
      for (p_Var8 = *(_Base_ptr *)(p_Var7 + 2); p_Var8 != p_Var7[2]._M_parent;
          p_Var8 = (_Base_ptr)&p_Var8[1]._M_parent) {
        local_88 = (void *)CONCAT44(local_88._4_4_,0x12);
        plStack_80 = (long *)0x0;
        local_78 = (ulong)p_Var8[1]._M_color << 0x20;
        VStack_70.m_internal =
             (((modules->
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
             super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
        local_68 = *(char **)p_Var8;
        pVStack_60 = (VkSpecializationInfo *)0x0;
        __position._M_current =
             (createInfos->
             super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (createInfos->
            super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
          ::_M_realloc_insert<vk::VkPipelineShaderStageCreateInfo_const&>
                    ((vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
                      *)createInfos,__position,(VkPipelineShaderStageCreateInfo *)&local_88);
        }
        else {
          (__position._M_current)->pName = local_68;
          (__position._M_current)->pSpecializationInfo = (VkSpecializationInfo *)0x0;
          (__position._M_current)->flags = (undefined4)local_78;
          (__position._M_current)->stage = local_78._4_4_;
          ((__position._M_current)->module).m_internal = VStack_70.m_internal;
          *(void **)__position._M_current = local_88;
          (__position._M_current)->pNext = (void *)0x0;
          ppVVar3 = &(createInfos->
                     super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppVVar3 = *ppVVar3 + 1;
        }
      }
      if (plVar6 != (long *)0x0) {
        LOCK();
        plVar1 = plVar6 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        UNLOCK();
        if ((int)*plVar1 == 0) {
          (**(code **)(*plVar6 + 0x10))(plVar6);
        }
        LOCK();
        piVar2 = (int *)((long)plVar6 + 0xc);
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (plVar6 != (long *)0x0)) {
          (**(code **)(*plVar6 + 8))();
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_50);
  }
  return;
}

Assistant:

void createPipelineShaderStages (const DeviceInterface&						vk,
								 const VkDevice								vkDevice,
								 InstanceContext&							instance,
								 Context&									context,
								 vector<ModuleHandleSp>&					modules,
								 vector<VkPipelineShaderStageCreateInfo>&	createInfos)
{
	for (ModuleMap::const_iterator moduleNdx = instance.moduleMap.begin(); moduleNdx != instance.moduleMap.end(); ++moduleNdx)
	{
		const ModuleHandleSp mod(new Unique<VkShaderModule>(createShaderModule(vk, vkDevice, context.getBinaryCollection().get(moduleNdx->first), 0)));
		modules.push_back(ModuleHandleSp(mod));
		for (vector<EntryToStage>::const_iterator shaderNdx = moduleNdx->second.begin(); shaderNdx != moduleNdx->second.end(); ++shaderNdx)
		{
			const EntryToStage&						stage			= *shaderNdx;
			const VkPipelineShaderStageCreateInfo	shaderParam		=
			{
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	//	VkStructureType			sType;
				DE_NULL,												//	const void*				pNext;
				(VkPipelineShaderStageCreateFlags)0,
				stage.second,											//	VkShaderStageFlagBits	stage;
				**modules.back(),										//	VkShaderModule			module;
				stage.first.c_str(),									//	const char*				pName;
				(const VkSpecializationInfo*)DE_NULL,
			};
			createInfos.push_back(shaderParam);
		}
	}
}